

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

bool ONX_ModelPrivate::GetEntireRDKDocument
               (ONX_Model_UserData *docud,ON_wString *xml,ONX_Model *model)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  wchar_t *sWideChar;
  ulong uVar5;
  size_t count;
  int utf8_length;
  ON_String s;
  int num_embedded_files;
  int version;
  undefined1 local_318 [16];
  uint error_status;
  ON_Read3dmBufferArchive archive;
  
  bVar1 = IsRDKDocumentInformation(docud);
  if (!bVar1) {
    return false;
  }
  ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
            (&archive,(long)(docud->m_goo).m_value,(docud->m_goo).m_goo,false,
             docud->m_usertable_3dm_version,docud->m_usertable_opennurbs_version);
  version = 0;
  bVar1 = ON_BinaryArchive::ReadInt(&archive.super_ON_BinaryArchive,&version);
  if (bVar1) {
    if (version == 1) {
      bVar1 = ON_BinaryArchive::ReadString(&archive.super_ON_BinaryArchive,xml);
      if (!bVar1) goto LAB_00469069;
    }
    else if (version - 3U < 2) {
      utf8_length = 0;
      bVar1 = ON_BinaryArchive::ReadInt(&archive.super_ON_BinaryArchive,&utf8_length);
      if (((!bVar1) || (uVar5 = (ulong)(uint)utf8_length, utf8_length < 1)) ||
         (ON_REMOVE_ASAP_AssertEx
                    (~(uint)(uVar5 + 8) >> 0x1f,
                     "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                     ,0x1401,"","length <= INT_MAX is false"),
         (ulong)(long)(docud->m_goo).m_value < uVar5 + 8)) goto LAB_00469069;
      ON_String::ON_String(&s);
      ON_String::SetLength(&s,(long)utf8_length);
      count = (size_t)utf8_length;
      pcVar4 = ON_String::Array(&s);
      bVar1 = ON_BinaryArchive::ReadChar(&archive.super_ON_BinaryArchive,count,pcVar4);
      if (!bVar1) {
LAB_0046905f:
        ON_String::~ON_String(&s);
        goto LAB_00469069;
      }
      bVar1 = ON_String::IsNotEmpty(&s);
      if (bVar1) {
        pcVar4 = ON_String::Array(&s);
        error_status = 0;
        uVar2 = ON_ConvertUTF8ToWideChar
                          (0,pcVar4,-1,(wchar_t *)0x0,0,&error_status,0,0,(char **)0x0);
        if (error_status == 0 && 0 < (int)uVar2) {
          ON_wString::SetLength(xml,(ulong)uVar2);
          sWideChar = ON_wString::Array(xml);
          ON_ConvertUTF8ToWideChar(0,pcVar4,-1,sWideChar,uVar2 + 1,&error_status,0,0,(char **)0x0);
        }
        if (error_status != 0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                     ,0x1534,"","RDK xml document settings is not a valid UTF-8 string.");
        }
      }
      if ((model != (ONX_Model *)0x0) && (RemoveAllEmbeddedFiles(model), version == 4)) {
        num_embedded_files = 0;
        bVar1 = ON_BinaryArchive::ReadInt(&archive.super_ON_BinaryArchive,&num_embedded_files);
        if (!bVar1) goto LAB_0046905f;
        if (0 < num_embedded_files) {
          iVar3 = 0;
          do {
            ON_EmbeddedFile::ON_EmbeddedFile((ON_EmbeddedFile *)&error_status);
            ON_EmbeddedFile::Read((ON_EmbeddedFile *)&error_status,&archive.super_ON_BinaryArchive);
            ONX_Model::AddModelComponent
                      ((ONX_Model *)local_318,(ON_ModelComponent *)model,
                       SUB81((ON_EmbeddedFile *)&error_status,0));
            ON_ModelComponentReference::~ON_ModelComponentReference
                      ((ON_ModelComponentReference *)local_318);
            ON_EmbeddedFile::~ON_EmbeddedFile((ON_EmbeddedFile *)&error_status);
            iVar3 = iVar3 + 1;
          } while (iVar3 < num_embedded_files);
        }
      }
      ON_String::~ON_String(&s);
    }
    iVar3 = ON_wString::Length(xml);
    bVar1 = 0 < iVar3;
  }
  else {
LAB_00469069:
    bVar1 = false;
  }
  ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive(&archive);
  return bVar1;
}

Assistant:

bool ONX_ModelPrivate::GetEntireRDKDocument(const ONX_Model_UserData& docud, ON_wString& xml, ONX_Model* model) // Static.
{
  if (!::IsRDKDocumentInformation(docud))
    return false;

  ON_Read3dmBufferArchive archive(docud.m_goo.m_value, docud.m_goo.m_goo, false, docud.m_usertable_3dm_version, docud.m_usertable_opennurbs_version);

  int version = 0;
  if (!archive.ReadInt(&version))
    return false;

  if (1 == version)
  {
    // Version 1 was a UTF-16 string.
    if (!archive.ReadString(xml))
      return false;
  }
  else
  if ((3 == version) || (4 == version))
  {
    // Version 4 files are exactly the same as version 3, but with the addition of embedded files.

    // Version 3 and 4 is a UTF-8 string.
    int utf8_length = 0;
    if (!archive.ReadInt(&utf8_length))
      return false;

    if (utf8_length <= 0)
      return false;

    const size_t length_so_far = ArchiveLengthUpToEmbeddedFiles(utf8_length);
    if (length_so_far > size_t(docud.m_goo.m_value))
      return false; // Sanity check.

    ON_String s;
    s.SetLength(utf8_length);
    if (!archive.ReadChar(utf8_length, s.Array()))
      return false;

    if (s.IsNotEmpty())
    {
      const char* sArray = s.Array();
      unsigned int error_status = 0;
      auto wideLength = ON_ConvertUTF8ToWideChar(false, sArray, -1, 0, 0, &error_status, 0, 0, 0);
      if ((wideLength > 0) && (0 == error_status))
      {
        xml.SetLength(wideLength);
        ON_ConvertUTF8ToWideChar(false, sArray, -1, xml.Array(), wideLength+1, &error_status, 0, 0, 0);
      }

      if (0 != error_status)
      {
        ON_ERROR("RDK xml document settings is not a valid UTF-8 string.");
      }
    }

    if (nullptr != model)
    {
      RemoveAllEmbeddedFiles(*model);

      if (4 == version)
      {
        // Read the number of embedded files.
        int num_embedded_files = 0;
        if (!archive.ReadInt(&num_embedded_files))
          return false;

        // Create an ON_EmbeddedFile object for each embedded file.
        for (int i = 0; i < num_embedded_files; i++)
        {
          // We keep the embedded file object even if it fails to load; then it will have an error flag set.
          // See ON_EmbeddedFile::Error().
          ON_EmbeddedFile ef;
          ef.Read(archive);
          model->AddModelComponent(ef);
        }
      }
    }
  }

  return xml.Length() > 0;
}